

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readObject(Reader *this,Token *param_1)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  bool local_192;
  bool local_15a;
  allocator<char> local_141;
  string local_140;
  bool local_11a;
  allocator<char> local_119;
  undefined1 local_118 [6];
  bool finalizeTokenOk;
  undefined1 local_f8 [8];
  Token comma;
  Value *pVStack_d8;
  bool ok;
  Value *local_d0;
  Value *value;
  string local_c0;
  undefined1 local_a0 [8];
  Token colon;
  bool local_7d;
  bool initialTokenOk;
  Value local_70;
  undefined1 local_58 [8];
  string name;
  Token tokenName;
  Token *param_1_local;
  Reader *this_local;
  
  std::__cxx11::string::string((string *)local_58);
  Value::Value(&local_70,objectValue);
  pVVar2 = currentValue(this);
  Value::operator=(pVVar2,&local_70);
  Value::~Value(&local_70);
  do {
    bVar1 = readToken(this,(Token *)((long)&name.field_2 + 8));
    if (!bVar1) {
LAB_001679f5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Missing \'}\' or object member name",&local_141);
      this_local._7_1_ =
           addErrorAndRecover(this,&local_140,(Token *)((long)&name.field_2 + 8),tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      goto LAB_00167aa8;
    }
    local_7d = true;
    while( true ) {
      local_15a = false;
      if (name.field_2._8_4_ == 0xc) {
        local_15a = local_7d;
      }
      if (local_15a == false) break;
      local_7d = readToken(this,(Token *)((long)&name.field_2 + 8));
    }
    if (local_7d == false) goto LAB_001679f5;
    if ((name.field_2._8_4_ == 2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      this_local._7_1_ = true;
      goto LAB_00167aa8;
    }
    if (name.field_2._8_4_ != 5) goto LAB_001679f5;
    std::__cxx11::string::operator=((string *)local_58,anon_var_dwarf_65182 + 9);
    bVar1 = decodeString(this,(Token *)((long)&name.field_2 + 8),(string *)local_58);
    if (!bVar1) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      goto LAB_00167aa8;
    }
    bVar1 = readToken(this,(Token *)local_a0);
    if ((!bVar1) || (local_a0._0_4_ != tokenMemberSeparator)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Missing \':\' after object member name",
                 (allocator<char> *)((long)&value + 7));
      this_local._7_1_ = addErrorAndRecover(this,&local_c0,(Token *)local_a0,tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
      goto LAB_00167aa8;
    }
    pVVar2 = currentValue(this);
    pVStack_d8 = Value::operator[](pVVar2,(string *)local_58);
    local_d0 = pVStack_d8;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              (&this->nodes_,&stack0xffffffffffffff28);
    comma.end_._7_1_ = readValue(this);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
    if ((comma.end_._7_1_ & 1) == 0) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      goto LAB_00167aa8;
    }
    bVar1 = readToken(this,(Token *)local_f8);
    if ((!bVar1) ||
       (((local_f8._0_4_ != tokenObjectEnd && (local_f8._0_4_ != tokenArraySeparator)) &&
        (local_f8._0_4_ != tokenComment)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_118,"Missing \',\' or \'}\' in object declaration",&local_119);
      this_local._7_1_ =
           addErrorAndRecover(this,(string *)local_118,(Token *)local_f8,tokenObjectEnd);
      std::__cxx11::string::~string((string *)local_118);
      std::allocator<char>::~allocator(&local_119);
      goto LAB_00167aa8;
    }
    local_11a = true;
    while( true ) {
      local_192 = false;
      if (local_f8._0_4_ == tokenComment) {
        local_192 = local_11a;
      }
      if (local_192 == false) break;
      local_11a = readToken(this,(Token *)local_f8);
    }
  } while (local_f8._0_4_ != tokenObjectEnd);
  this_local._7_1_ = true;
LAB_00167aa8:
  colon.end_._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool 
Reader::readObject( Token &/*tokenStart*/ )
{
   Token tokenName;
   std::string name;
   currentValue() = Value( objectValue );
   while ( readToken( tokenName ) )
   {
      bool initialTokenOk = true;
      while ( tokenName.type_ == tokenComment  &&  initialTokenOk )
         initialTokenOk = readToken( tokenName );
      if  ( !initialTokenOk )
         break;
      if ( tokenName.type_ == tokenObjectEnd  &&  name.empty() )  // empty object
         return true;
      if ( tokenName.type_ != tokenString )
         break;
      
      name = "";
      if ( !decodeString( tokenName, name ) )
         return recoverFromError( tokenObjectEnd );

      Token colon;
      if ( !readToken( colon ) ||  colon.type_ != tokenMemberSeparator )
      {
         return addErrorAndRecover( "Missing ':' after object member name", 
                                    colon, 
                                    tokenObjectEnd );
      }
      Value &value = currentValue()[ name ];
      nodes_.push( &value );
      bool ok = readValue();
      nodes_.pop();
      if ( !ok ) // error already set
         return recoverFromError( tokenObjectEnd );

      Token comma;
      if ( !readToken( comma )
            ||  ( comma.type_ != tokenObjectEnd  &&  
                  comma.type_ != tokenArraySeparator &&
                  comma.type_ != tokenComment ) )
      {
         return addErrorAndRecover( "Missing ',' or '}' in object declaration", 
                                    comma, 
                                    tokenObjectEnd );
      }
      bool finalizeTokenOk = true;
      while ( comma.type_ == tokenComment &&
              finalizeTokenOk )
         finalizeTokenOk = readToken( comma );
      if ( comma.type_ == tokenObjectEnd )
         return true;
   }
   return addErrorAndRecover( "Missing '}' or object member name", 
                              tokenName, 
                              tokenObjectEnd );
}